

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O1

MoleculeStampSet * __thiscall
OpenMD::SelectionManager::getSelectedMoleculeStamps
          (MoleculeStampSet *__return_storage_ptr__,SelectionManager *this)

{
  _Rb_tree_header *p_Var1;
  pointer pOVar2;
  Molecule *pMVar3;
  void *pvVar4;
  uint *puVar5;
  uint uVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int nproc;
  int count_local;
  vector<int,_std::allocator<int>_> foundStamps;
  MoleculeStamp *local_88;
  vector<int,_std::allocator<int>_> fsGlobal;
  vector<int,_std::allocator<int>_> counts;
  vector<int,_std::allocator<int>_> disps;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar2 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = *(long *)&pOVar2[5].bitset_.super__Bvector_base<std::allocator<bool>_>;
  if (((long)(((_Bit_iterator *)
              ((long)&pOVar2[5].bitset_.super__Bvector_base<std::allocator<bool>_> + 0x10))->
             super__Bit_iterator_base)._M_p - lVar12) * 8 +
      (ulong)*(uint *)((long)&pOVar2[5].bitset_.super__Bvector_base<std::allocator<bool>_> + 0x18)
      != 0) {
    lVar14 = 0;
    uVar13 = 0;
    do {
      uVar8 = lVar14 >> 0x20;
      uVar9 = uVar8 + 0x3f;
      if (-1 < (long)uVar8) {
        uVar9 = uVar8;
      }
      if (((*(ulong *)(lVar12 + ((long)uVar9 >> 6) * 8 + -8 +
                      (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
            (uVar13 & 0x3f) & 1) != 0) &&
         (pMVar3 = (this->molecules_).
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar13], pMVar3 != (Molecule *)0x0)) {
        foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)pMVar3->molStamp_;
        std::
        _Rb_tree<OpenMD::MoleculeStamp*,OpenMD::MoleculeStamp*,std::_Identity<OpenMD::MoleculeStamp*>,OpenMD::MoleculeStampCompare,std::allocator<OpenMD::MoleculeStamp*>>
        ::_M_insert_unique<OpenMD::MoleculeStamp*>
                  ((_Rb_tree<OpenMD::MoleculeStamp*,OpenMD::MoleculeStamp*,std::_Identity<OpenMD::MoleculeStamp*>,OpenMD::MoleculeStampCompare,std::allocator<OpenMD::MoleculeStamp*>>
                    *)__return_storage_ptr__,(MoleculeStamp **)&foundStamps);
      }
      uVar13 = uVar13 + 1;
      pOVar2 = (this->ss_).bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar12 = *(long *)&pOVar2[5].bitset_.super__Bvector_base<std::allocator<bool>_>;
      lVar14 = lVar14 + 0x100000000;
    } while (uVar13 < (ulong)*(uint *)((long)&pOVar2[5].bitset_.
                                              super__Bvector_base<std::allocator<bool>_> + 0x18) +
                      ((long)(((_Bit_iterator *)
                              ((long)&pOVar2[5].bitset_.super__Bvector_base<std::allocator<bool>_> +
                              0x10))->super__Bit_iterator_base)._M_p - lVar12) * 8);
  }
  foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var7 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
      _0_4_ = *(int *)(*(long *)(p_Var7 + 1) + 0x1f8);
      if (foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&foundStamps,
                   (iterator)
                   foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&counts);
      }
      else {
        *foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (int)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  count_local = (int)((ulong)((long)foundStamps.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_start) >> 2);
  MPI_Comm_size(&ompi_mpi_comm_world,&nproc);
  disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&counts,(long)nproc,(value_type_conflict2 *)&disps,(allocator_type *)&fsGlobal);
  fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&disps,(long)nproc,(value_type_conflict2 *)&fsGlobal,(allocator_type *)&local_88);
  MPI_Allgather(&count_local,1,&ompi_mpi_int,
                CONCAT44(counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start),1,&ompi_mpi_int,&ompi_mpi_comm_world
               );
  piVar10 = (int *)CONCAT44(disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  *piVar10 = 0;
  puVar5 = (uint *)CONCAT44(counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  uVar6 = *puVar5;
  if (1 < nproc) {
    iVar11 = *piVar10;
    lVar12 = 1;
    do {
      iVar11 = iVar11 + puVar5[lVar12 + -1];
      piVar10[lVar12] = iVar11;
      uVar6 = uVar6 + puVar5[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 < nproc);
  }
  if (0 < (int)uVar6) {
    std::vector<int,_std::allocator<int>_>::vector
              (&fsGlobal,(ulong)uVar6,(allocator_type *)&local_88);
    MPI_Allgatherv(foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,count_local,&ompi_mpi_int,
                   CONCAT44(fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_),
                   CONCAT44(counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start),
                   CONCAT44(disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_),&ompi_mpi_int,
                   &ompi_mpi_comm_world);
    piVar10 = (int *)CONCAT44(fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (piVar10 !=
        fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        local_88 = (this->info_->moleculeStamps_).
                   super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[*piVar10];
        std::
        _Rb_tree<OpenMD::MoleculeStamp*,OpenMD::MoleculeStamp*,std::_Identity<OpenMD::MoleculeStamp*>,OpenMD::MoleculeStampCompare,std::allocator<OpenMD::MoleculeStamp*>>
        ::_M_insert_unique<OpenMD::MoleculeStamp*>
                  ((_Rb_tree<OpenMD::MoleculeStamp*,OpenMD::MoleculeStamp*,std::_Identity<OpenMD::MoleculeStamp*>,OpenMD::MoleculeStampCompare,std::allocator<OpenMD::MoleculeStamp*>>
                    *)__return_storage_ptr__,&local_88);
        piVar10 = piVar10 + 1;
      } while (piVar10 !=
               fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    pvVar4 = (void *)CONCAT44(fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)fsGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
    }
  }
  pvVar4 = (void *)CONCAT44(disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  pvVar4 = (void *)CONCAT44(counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)foundStamps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MoleculeStampSet SelectionManager::getSelectedMoleculeStamps() {
    MoleculeStampSet moleculeStamps;

    for (size_t i = 0; i < ss_.bitsets_[MOLECULE].size(); ++i) {
      if (ss_.bitsets_[MOLECULE][i]) {
        // check that this processor owns this molecule
        if (molecules_[i] != NULL) {
          Molecule* mol = static_cast<Molecule*>(molecules_[i]);
          moleculeStamps.insert(mol->getMolStamp());
        }
      }
    }

#ifdef IS_MPI
    std::vector<int> foundStamps;
    MoleculeStampSet::iterator i;
    for (i = moleculeStamps.begin(); i != moleculeStamps.end(); ++i)
      foundStamps.push_back((*i)->getIdent());

    // count_local holds the number of found stamps on this processor
    int count_local = foundStamps.size();

    int nproc;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);

    // we need arrays to hold the counts and displacement vectors for
    // all processors
    std::vector<int> counts(nproc, 0);
    std::vector<int> disps(nproc, 0);

    // fill the counts array
    MPI_Allgather(&count_local, 1, MPI_INT, &counts[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    // use the processor counts to compute the displacement array
    disps[0]       = 0;
    int totalCount = counts[0];
    for (int iproc = 1; iproc < nproc; iproc++) {
      disps[iproc] = disps[iproc - 1] + counts[iproc - 1];
      totalCount += counts[iproc];
    }

    if (totalCount > 0) {
      // we need a (possibly redundant) set of all found stamps:
      std::vector<int> fsGlobal(totalCount);

      // now spray out the foundStamps to all the other processors:
      MPI_Allgatherv(&foundStamps[0], count_local, MPI_INT, &fsGlobal[0],
                     &counts[0], &disps[0], MPI_INT, MPI_COMM_WORLD);

      std::vector<int>::iterator j;

      for (j = fsGlobal.begin(); j != fsGlobal.end(); ++j)
        moleculeStamps.insert(info_->getMoleculeStamp(*j));
    }
#endif

    return moleculeStamps;
  }